

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::SPxQuicksort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start,bool type)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  
  if (start + 1 < end) {
    uVar10 = end - 1;
    uVar7 = uVar10 - start;
    if (0x18 < (int)uVar7) {
LAB_0022cd1a:
      iVar8 = (uVar7 >> 1) + start;
      iVar3 = keys[iVar8];
      pdVar5 = compare->weight;
      lVar11 = (long)(int)uVar10;
      lVar12 = (long)start;
      uVar7 = uVar10;
      uVar14 = start;
      do {
        uVar9 = (ulong)uVar7;
        uVar15 = uVar14;
        if ((type & 1U) == 0) {
          if ((int)uVar14 < (int)uVar10) {
            dVar1 = pdVar5[iVar3];
            lVar13 = 0;
            do {
              dVar2 = pdVar5[keys[(int)uVar14 + lVar13]];
              if (((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) && (0.0 < dVar2 - dVar1)) {
                uVar15 = uVar14 + (int)lVar13;
                break;
              }
              lVar13 = lVar13 + 1;
              uVar15 = uVar10;
            } while (lVar11 - (int)uVar14 != lVar13);
          }
          if (start < (int)uVar7) {
            uVar9 = (ulong)(int)uVar7;
            do {
              if (pdVar5[keys[uVar9]] <= pdVar5[iVar3]) goto LAB_0022ce14;
              uVar9 = uVar9 - 1;
            } while (lVar12 < (long)uVar9);
            goto LAB_0022ce12;
          }
        }
        else {
          if ((int)uVar14 < (int)uVar10) {
            lVar13 = 0;
            do {
              if (pdVar5[iVar3] < pdVar5[keys[(int)uVar14 + lVar13]] ||
                  pdVar5[iVar3] == pdVar5[keys[(int)uVar14 + lVar13]]) {
                uVar15 = uVar14 + (int)lVar13;
                break;
              }
              lVar13 = lVar13 + 1;
              uVar15 = uVar10;
            } while (lVar11 - (int)uVar14 != lVar13);
          }
          if (start < (int)uVar7) {
            dVar1 = pdVar5[iVar3];
            uVar9 = (ulong)(int)uVar7;
            do {
              dVar2 = pdVar5[keys[uVar9]];
              if (((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) && (dVar2 - dVar1 < 0.0))
              goto LAB_0022ce14;
              uVar9 = uVar9 - 1;
            } while (lVar12 < (long)uVar9);
LAB_0022ce12:
            uVar9 = (ulong)(uint)start;
          }
        }
LAB_0022ce14:
        uVar7 = (uint)uVar9;
        if ((int)uVar7 <= (int)uVar15) goto LAB_0022ce39;
        iVar4 = keys[(int)uVar15];
        keys[(int)uVar15] = keys[(int)uVar7];
        keys[(int)uVar7] = iVar4;
        uVar14 = uVar15 + 1;
        uVar7 = uVar7 - 1;
      } while( true );
    }
LAB_0022cf67:
    if (0 < (int)uVar7) {
      SPxShellsort<int,soplex::Compare<double>>(keys,uVar10,compare,start);
      return;
    }
  }
  return;
LAB_0022ce39:
  if ((type & 1U) == 0) {
    if (start < (int)uVar7) {
      dVar1 = compare->weight[iVar3];
      uVar9 = (ulong)(int)uVar7;
      do {
        dVar2 = compare->weight[keys[uVar9]];
        if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (0.0 < dVar1 - dVar2))
        goto LAB_0022cecd;
        uVar9 = uVar9 - 1;
      } while (lVar12 < (long)uVar9);
      uVar9 = (ulong)(uint)start;
    }
LAB_0022cecd:
    uVar7 = (uint)uVar9;
    if (uVar7 == uVar10) {
      iVar3 = keys[(int)uVar7];
      keys[(int)uVar7] = keys[iVar8];
      keys[iVar8] = iVar3;
      uVar7 = uVar7 - 1;
    }
  }
  else {
    uVar14 = uVar15;
    if ((int)uVar15 < (int)uVar10) {
      dVar1 = compare->weight[iVar3];
      lVar12 = 0;
      do {
        dVar2 = compare->weight[keys[(int)uVar15 + lVar12]];
        if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (dVar1 - dVar2 < 0.0)) {
          uVar14 = uVar15 + (int)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
        uVar14 = uVar10;
      } while (lVar11 - (int)uVar15 != lVar12);
    }
    uVar15 = uVar14;
    if (uVar15 == start) {
      iVar3 = keys[(int)uVar15];
      keys[(int)uVar15] = keys[iVar8];
      keys[iVar8] = iVar3;
      uVar15 = uVar15 + 1;
    }
  }
  if ((int)(uVar10 - uVar15) < (int)(uVar7 - start)) {
    bVar6 = (int)uVar10 <= (int)uVar15;
    uVar14 = uVar7;
    uVar7 = uVar10;
    uVar10 = uVar15;
    uVar15 = start;
    if (bVar6) goto LAB_0022cf4d;
  }
  else {
    bVar6 = (int)uVar7 <= start;
    uVar14 = uVar10;
    uVar10 = start;
    start = uVar15;
    if (bVar6) goto LAB_0022cf4d;
  }
  SPxQuicksort<int,soplex::Compare<double>>(keys,uVar7 + 1,compare,uVar10,(bool)(~type & 1));
  start = uVar15;
LAB_0022cf4d:
  uVar10 = uVar14;
  type = (bool)(type ^ 1);
  uVar7 = uVar10 - start;
  if ((int)uVar7 < 0x19) goto LAB_0022cf67;
  goto LAB_0022cd1a;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}